

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_cppcheck.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 0;
  if (1 < argc) {
    iVar2 = 0;
    uVar3 = 1;
    do {
      __s1 = argv[uVar3];
      iVar1 = strcmp(__s1,"-bad");
      if (iVar1 == 0) {
        main_cold_2();
        return 1;
      }
      iVar1 = strcmp(__s1,"-error");
      if (iVar1 == 0) {
        iVar2 = 5;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  main_cold_1();
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
  int i;
  int result = 0;
  for (i = 1; i < argc; ++i) {
    if (strcmp(argv[i], "-bad") == 0) {
      fprintf(stdout, "stdout from bad command line arg '-bad'\n");
      fprintf(stderr, "stderr from bad command line arg '-bad'\n");
      return 1;
    } else if (strcmp(argv[i], "-error") == 0) {
      // The real cppcheck allows to set the exitcode with --error-exitcode
      result = 5;
    }
  }
  fprintf(stderr,
          "[/foo/bar.c:2]: (error) Array 'abc[10]' accessed at index 12,"
          " which is out of bounds.\n");
  fprintf(stderr,
          "[/foo/bar.c:2]: (warning) Member variable 'foo::bar' is "
          "not initialized in the constructor.\n");
  fprintf(stderr, "[/foo/bar.c:2]: (style) C-style pointer casting.\n");
  fprintf(stderr,
          "[/foo/bar.c:2]: (performance) Variable 'm_message' is "
          "assigned in constructor body. Consider performing "
          "initialization in initialization list.\n");
  fprintf(stderr,
          "[/foo/bar.c:2]: (portability) scanf without field width "
          "limits can crash with huge input data on some versions of "
          "libc\n");
  fprintf(stderr,
          "[/foo/bar.c:2]: (information) cannot find all the include "
          "files (use --check-config for details)\n");

  return result;
}